

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O2

bool __thiscall SymbolTable::add(SymbolTable *this,Symbol s)

{
  int iVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  Symbol s_00;
  
  s_00.val = s.val;
  uVar3 = this->nSymbols;
  uVar4 = (uint)uVar3;
  iVar1 = (int)(s.icl >> 0x1c);
  uVar5 = iVar1 * -8 + 0x40U | (uint)s.icl & 0xf0000000 | (uint)uVar3 * 0x10000 + 0x1000000;
  if (iVar1 == 2) {
    this->shortCodes[s_00.val.num & 0xffff] = uVar3 + 0x2100;
  }
  else if (iVar1 == 1) {
    this->byteCodes[s_00.val.num & 0xff] = uVar3 + 0x1100;
  }
  else {
    s_00.icl._0_4_ = uVar5;
    s_00.icl._4_4_ = 0;
    bVar2 = hashInsert(this,s_00);
    if (!bVar2) {
      return false;
    }
    uVar3 = this->nSymbols;
    uVar4 = (uint)uVar3;
  }
  this->nSymbols = uVar3 + 1;
  ((anon_union_8_2_43acef4c_for_val *)((long)&this->symbols[0x100].val + (ulong)(uVar4 << 4)))->num
       = (u64)s_00.val;
  *(ulong *)((long)&this->symbols[0x100].icl + (ulong)(uVar4 << 4)) = (ulong)uVar5;
  this->lenHisto[iVar1 - 1] = this->lenHisto[iVar1 - 1] + 1;
  return true;
}

Assistant:

bool add(Symbol s) {
      assert(FSST_CODE_BASE + nSymbols < FSST_CODE_MAX);
      u32 len = s.length();
      s.set_code_len(FSST_CODE_BASE + nSymbols, len);
      if (len == 1) {
         byteCodes[s.first()] = FSST_CODE_BASE + nSymbols + (1<<FSST_LEN_BITS); // len=1 (<<FSST_LEN_BITS)
      } else if (len == 2) {
         shortCodes[s.first2()] = FSST_CODE_BASE + nSymbols + (2<<FSST_LEN_BITS); // len=2 (<<FSST_LEN_BITS)
      } else if (!hashInsert(s)) {
         return false;
      }
      symbols[FSST_CODE_BASE + nSymbols++] = s;
      lenHisto[len-1]++;
      return true;
   }